

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::Write(DBImpl *this,WriteOptions *options,WriteBatch *updates)

{
  bool bVar1;
  int iVar2;
  reference ppWVar3;
  DBImpl *this_00;
  WriteBatch *in_RCX;
  byte *in_RDX;
  MemTable *in_RSI;
  CondVar *in_RDI;
  Writer *ready;
  bool sync_error;
  WriteBatch *write_batch;
  Writer *last_writer;
  uint64_t last_sequence;
  MutexLock l;
  Writer w;
  Status *status;
  Mutex *in_stack_fffffffffffffef8;
  DBImpl *in_stack_ffffffffffffff00;
  uint7 in_stack_ffffffffffffff08;
  undefined1 uVar4;
  CondVar *this_01;
  WriteBatch *in_stack_ffffffffffffff28;
  value_type pWVar5;
  undefined1 local_c8 [15];
  byte local_b9;
  Slice local_b8;
  WriteBatch *local_a0;
  value_type last_writer_00;
  undefined8 in_stack_ffffffffffffff70;
  Slice *slice;
  uint in_stack_ffffffffffffff78;
  uint uVar6;
  undefined4 in_stack_ffffffffffffff7c;
  Writer local_70;
  WriteBatch *local_20;
  byte *local_18;
  
  this_01 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  Writer::Writer((Writer *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_70.batch = local_20;
  local_70.sync = (bool)(*local_18 & 1);
  local_70.done = false;
  MutexLock::MutexLock((MutexLock *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::push_back
            ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
             in_stack_ffffffffffffff00,(value_type *)in_stack_fffffffffffffef8);
  while( true ) {
    uVar4 = false;
    if ((local_70.done & 1U) == 0) {
      ppWVar3 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::
                front((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
                       *)this_01);
      uVar4 = &local_70 != *ppWVar3;
    }
    if ((bool)uVar4 == false) break;
    port::CondVar::Wait(this_01);
  }
  if ((local_70.done & 1U) == 0) {
    uVar6 = in_stack_ffffffffffffff78 & 0xffffff;
    MakeRoomForWrite((DBImpl *)
                     (CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78) &
                     0xffffffff00ffffff),SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0));
    this_00 = (DBImpl *)VersionSet::LastSequence(*(VersionSet **)&in_RSI[0x17].refs_);
    last_writer_00 = &local_70;
    bVar1 = Status::ok((Status *)this_01);
    if ((bVar1) && (local_20 != (WriteBatch *)0x0)) {
      local_a0 = BuildBatchGroup(this_00,(Writer **)last_writer_00);
      WriteBatchInternal::SetSequence
                ((WriteBatch *)in_stack_ffffffffffffff00,(SequenceNumber)in_stack_fffffffffffffef8);
      iVar2 = WriteBatchInternal::Count((WriteBatch *)0x1133b0);
      slice = (Slice *)((long)(this_00->options_).compressors + (long)iVar2 + -0x80);
      port::Mutex::Unlock((Mutex *)0x1133cd);
      in_stack_ffffffffffffff00 =
           (DBImpl *)
           in_RSI[0x15].arena_.blocks_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_b8 = WriteBatchInternal::Contents((WriteBatch *)0x1133e8);
      log::Writer::AddRecord((Writer *)CONCAT44(in_stack_ffffffffffffff7c,uVar6),slice);
      Status::operator=((Status *)in_stack_ffffffffffffff00,(Status *)in_stack_fffffffffffffef8);
      Status::~Status((Status *)in_stack_ffffffffffffff00);
      local_b9 = 0;
      bVar1 = Status::ok((Status *)this_01);
      if ((bVar1) && ((*local_18 & 1) != 0)) {
        (**(code **)(*(long *)in_RSI[0x15].arena_.alloc_ptr_ + 0x28))(local_c8);
        Status::operator=((Status *)in_stack_ffffffffffffff00,(Status *)in_stack_fffffffffffffef8);
        Status::~Status((Status *)in_stack_ffffffffffffff00);
        bVar1 = Status::ok((Status *)this_01);
        if (!bVar1) {
          local_b9 = 1;
        }
      }
      bVar1 = Status::ok((Status *)this_01);
      if (bVar1) {
        WriteBatchInternal::InsertInto(in_stack_ffffffffffffff28,in_RSI);
        Status::operator=((Status *)in_stack_ffffffffffffff00,(Status *)in_stack_fffffffffffffef8);
        Status::~Status((Status *)in_stack_ffffffffffffff00);
      }
      port::Mutex::Lock((Mutex *)0x1134db);
      if ((local_b9 & 1) != 0) {
        RecordBackgroundError(in_stack_ffffffffffffff00,(Status *)in_stack_fffffffffffffef8);
      }
      if (local_a0 == (WriteBatch *)in_RSI[0x16].arena_.alloc_ptr_) {
        WriteBatch::Clear((WriteBatch *)in_stack_ffffffffffffff00);
      }
      VersionSet::SetLastSequence(*(VersionSet **)&in_RSI[0x17].refs_,(uint64_t)slice);
    }
    do {
      ppWVar3 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::
                front((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
                       *)this_01);
      pWVar5 = *ppWVar3;
      std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::pop_front
                ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
                 in_stack_ffffffffffffff00);
      if (pWVar5 != &local_70) {
        Status::operator=((Status *)this_01,(Status *)CONCAT17(uVar4,in_stack_ffffffffffffff08));
        pWVar5->done = true;
        port::CondVar::Signal((CondVar *)0x11358e);
      }
    } while (pWVar5 != last_writer_00);
    bVar1 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::empty
                      ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
                        *)0x1135af);
    if (!bVar1) {
      std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::front
                ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
                 this_01);
      port::CondVar::Signal((CondVar *)0x1135d0);
    }
  }
  else {
    Status::Status((Status *)this_01,(Status *)(ulong)in_stack_ffffffffffffff08);
  }
  MutexLock::~MutexLock((MutexLock *)0x113606);
  Writer::~Writer((Writer *)in_stack_ffffffffffffff00);
  return (Status)(char *)in_RDI;
}

Assistant:

Status DBImpl::Write(const WriteOptions& options, WriteBatch* updates) {
  Writer w(&mutex_);
  w.batch = updates;
  w.sync = options.sync;
  w.done = false;

  MutexLock l(&mutex_);
  writers_.push_back(&w);
  while (!w.done && &w != writers_.front()) {
    w.cv.Wait();
  }
  if (w.done) {
    return w.status;
  }

  // May temporarily unlock and wait.
  Status status = MakeRoomForWrite(updates == nullptr);
  uint64_t last_sequence = versions_->LastSequence();
  Writer* last_writer = &w;
  if (status.ok() && updates != nullptr) {  // nullptr batch is for compactions
    WriteBatch* write_batch = BuildBatchGroup(&last_writer);
    WriteBatchInternal::SetSequence(write_batch, last_sequence + 1);
    last_sequence += WriteBatchInternal::Count(write_batch);

    // Add to log and apply to memtable.  We can release the lock
    // during this phase since &w is currently responsible for logging
    // and protects against concurrent loggers and concurrent writes
    // into mem_.
    {
      mutex_.Unlock();
      status = log_->AddRecord(WriteBatchInternal::Contents(write_batch));
      bool sync_error = false;
      if (status.ok() && options.sync) {
        status = logfile_->Sync();
        if (!status.ok()) {
          sync_error = true;
        }
      }
      if (status.ok()) {
        status = WriteBatchInternal::InsertInto(write_batch, mem_);
      }
      mutex_.Lock();
      if (sync_error) {
        // The state of the log file is indeterminate: the log record we
        // just added may or may not show up when the DB is re-opened.
        // So we force the DB into a mode where all future writes fail.
        RecordBackgroundError(status);
      }
    }
    if (write_batch == tmp_batch_) tmp_batch_->Clear();

    versions_->SetLastSequence(last_sequence);
  }

  while (true) {
    Writer* ready = writers_.front();
    writers_.pop_front();
    if (ready != &w) {
      ready->status = status;
      ready->done = true;
      ready->cv.Signal();
    }
    if (ready == last_writer) break;
  }

  // Notify new head of write queue
  if (!writers_.empty()) {
    writers_.front()->cv.Signal();
  }

  return status;
}